

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_1::TextureLookupSpec::TextureLookupSpec
          (TextureLookupSpec *this,Function function_,Vec4 *minCoord_,Vec4 *maxCoord_,bool useBias_,
          float minLodBias_,float maxLodBias_)

{
  float maxLodBias__local;
  float minLodBias__local;
  bool useBias__local;
  Vec4 *maxCoord__local;
  Vec4 *minCoord__local;
  Function function__local;
  TextureLookupSpec *this_local;
  
  this->function = function_;
  tcu::Vector<float,_4>::Vector(&this->minCoord,minCoord_);
  tcu::Vector<float,_4>::Vector(&this->maxCoord,maxCoord_);
  this->useBias = useBias_;
  this->minLodBias = minLodBias_;
  this->maxLodBias = maxLodBias_;
  return;
}

Assistant:

TextureLookupSpec (Function				function_,
					   const tcu::Vec4&		minCoord_,
					   const tcu::Vec4&		maxCoord_,
					   bool					useBias_,
					   float				minLodBias_,
					   float				maxLodBias_)
		: function		(function_)
		, minCoord		(minCoord_)
		, maxCoord		(maxCoord_)
		, useBias		(useBias_)
		, minLodBias	(minLodBias_)
		, maxLodBias	(maxLodBias_)
	{
	}